

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *line,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
          basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
          CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  pointer *ppbVar1;
  iterator __position;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  iterator iVar9;
  undefined1 compress_00;
  ulong __pos;
  undefined4 uVar10;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_50;
  undefined4 local_44;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  compress_00 = SUB81(sectionStartCharacters,0);
  local_40 = delimiterCharacters;
  local_38 = sectionStartCharacters;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     delimiterCharacters->_M_str,0,delimiterCharacters->_M_len);
  if (sVar3 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,this,line,
               (basic_string_view<char,_std::char_traits<char>_> *)((ulong)sectionMatch & 0xff),
               (bool)compress_00);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_44 = (int)sectionMatch;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,0,
                       line->_M_len);
    local_50 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__;
    if (sVar4 == 0xffffffffffffffff) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,__position,
                   (basic_string_view<char,_std::char_traits<char>_> *)this);
        __return_storage_ptr__ =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_50;
      }
      else {
        pcVar2 = *(char **)(this + 8);
        (__position._M_current)->_M_len = *(size_t *)this;
        (__position._M_current)->_M_str = pcVar2;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    else {
      uVar7 = *(ulong *)this;
      if (uVar7 != 0) {
        __pos = 0;
        do {
          if (sVar4 < sVar3) {
            uVar5 = sVar4 - __pos;
            if (uVar5 == 0) {
              if ((byte)local_44 == '\0') {
                local_68._M_len._0_4_ = 0;
                local_68._M_len = 0;
                local_68._M_str = (char *)0x0;
                iVar9._M_current =
                     *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
                uVar10 = 0;
                uVar8 = local_68._M_len;
                if (iVar9._M_current !=
                    *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10))
                goto LAB_003a1367;
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          (local_50,iVar9,&local_68);
              }
            }
            else {
              uVar8 = uVar7 - __pos;
              if (uVar5 <= uVar7 - __pos) {
                uVar8 = uVar5;
              }
              local_68._M_str = (char *)(__pos + *(long *)(this + 8));
              iVar9._M_current =
                   *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
              if (iVar9._M_current ==
                  *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10)) {
                local_68._M_len = uVar8;
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          (local_50,iVar9,&local_68);
              }
              else {
                local_68._M_len._0_4_ = (undefined4)uVar8;
                local_68._M_len._4_4_ = (undefined4)(uVar8 >> 0x20);
                uVar10 = local_68._M_len._4_4_;
LAB_003a1367:
                local_68._M_len = uVar8;
                *(undefined4 *)&(iVar9._M_current)->_M_len = (undefined4)local_68._M_len;
                *(undefined4 *)((long)&(iVar9._M_current)->_M_len + 4) = uVar10;
                (iVar9._M_current)->_M_str = local_68._M_str;
                *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 0x10;
              }
            }
            __pos = sVar4 + 1;
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str
                               ,__pos,line->_M_len);
          }
          else {
            sVar6 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                              (sVar3 + 1,(basic_string_view<char,_std::char_traits<char>_> *)this,
                               *(byte *)(*(long *)(this + 8) + sVar3),
                               *(char *)((long)&local_38->_M_len +
                                        (ulong)*(byte *)(*(long *)(this + 8) + sVar3)));
            if (sVar6 == 0xffffffffffffffff) {
              sVar6 = *(ulong *)this - __pos;
              if (*(ulong *)this < __pos) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",__pos);
              }
              local_68._M_str = (char *)(__pos + *(long *)(this + 8));
              iVar9._M_current =
                   *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
              local_68._M_len = sVar6;
              if (iVar9._M_current ==
                  *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10)) {
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          (local_50,iVar9,&local_68);
              }
              else {
                (iVar9._M_current)->_M_len = sVar6;
                (iVar9._M_current)->_M_str = local_68._M_str;
                *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 0x10;
              }
              __pos = *(ulong *)this;
            }
            else {
              sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,sVar6 + 1,line->_M_len);
              if (sVar3 == 0xffffffffffffffff) {
                sVar6 = *(ulong *)this - __pos;
                if (*(ulong *)this < __pos) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",__pos);
                }
                local_68._M_str = (char *)(__pos + *(long *)(this + 8));
                iVar9._M_current =
                     *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
                local_68._M_len = sVar6;
                if (iVar9._M_current ==
                    *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10)) {
                  std::
                  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                            (local_50,iVar9,&local_68);
                }
                else {
                  (iVar9._M_current)->_M_len = sVar6;
                  (iVar9._M_current)->_M_str = local_68._M_str;
                  *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 0x10;
                }
                __pos = 0xffffffffffffffff;
                sVar3 = 0xffffffffffffffff;
              }
              else {
                uVar7 = *(ulong *)this - __pos;
                if (*(ulong *)this < __pos) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",__pos);
                }
                local_68._M_len = sVar3 - __pos;
                if (uVar7 < sVar3 - __pos) {
                  local_68._M_len = uVar7;
                }
                local_68._M_str = (char *)(__pos + *(long *)(this + 8));
                iVar9._M_current =
                     *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
                if (iVar9._M_current ==
                    *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10)) {
                  std::
                  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                            (local_50,iVar9,&local_68);
                }
                else {
                  (iVar9._M_current)->_M_len = local_68._M_len;
                  (iVar9._M_current)->_M_str = local_68._M_str;
                  *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 0x10;
                }
                __pos = sVar3 + 1;
                sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                   local_40->_M_str,__pos,local_40->_M_len);
              }
              sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,__pos,line->_M_len);
            }
          }
          uVar7 = *(ulong *)this;
          if ((__pos != 0xffffffffffffffff) && (sVar4 == 0xffffffffffffffff)) {
            if (((byte)local_44 & uVar7 <= __pos) != 0) {
              return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50;
            }
            if (__pos <= uVar7) {
              local_68._M_str = (char *)(__pos + *(long *)(this + 8));
              iVar9._M_current =
                   *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 8);
              if (iVar9._M_current !=
                  *(basic_string_view<char,_std::char_traits<char>_> **)(local_50 + 0x10)) {
                (iVar9._M_current)->_M_len = uVar7 - __pos;
                (iVar9._M_current)->_M_str = local_68._M_str;
                *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 0x10;
                return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)local_50;
              }
              local_68._M_len = uVar7 - __pos;
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                        (local_50,iVar9,&local_68);
              return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_50;
            }
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",__pos);
          }
          __return_storage_ptr__ =
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_50;
        } while (__pos < uVar7);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}